

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O1

LY_ERR lyplg_ext_compile_extension_instance
                 (lysc_ctx *ctx,lysp_ext_instance *extp,lysc_ext_instance *ext)

{
  int *piVar1;
  ly_stmt lVar2;
  lysp_ext_substmt *plVar3;
  lysc_ext_substmt *plVar4;
  lysc_when **when_c;
  lysp_node *pnode;
  lysp_type *type_p;
  lysp_when *when_p;
  lysp_restr *plVar5;
  lysc_when *plVar6;
  void *pvVar7;
  ulong uVar8;
  bool bVar9;
  char *pcVar10;
  lysc_ext_substmt *plVar11;
  ly_bool lVar12;
  uint16_t uVar13;
  ushort uVar14;
  lysc_node *node;
  long *plVar15;
  void **ppvVar16;
  void **ppvVar17;
  lysp_ext_instance *plVar18;
  void **ppvVar19;
  void **ppvVar20;
  lysp_restr *must_p;
  lysp_ext_instance *extp_00;
  ly_ctx *plVar21;
  LY_ERR LVar22;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  lysp_ext_instance *plVar26;
  lysc_ext_substmt *plVar27;
  LY_ERR local_68;
  ly_bool enabled;
  undefined7 uStack_57;
  lysp_ext_instance *local_50;
  ly_set storagep_compiled;
  char *local_38;
  
  storagep_compiled.size = 0;
  storagep_compiled.count = 0;
  storagep_compiled.field_2.dnodes = (lyd_node **)0x0;
  if (ctx == (lysc_ctx *)0x0) {
    pcVar23 = "ctx";
    plVar21 = (ly_ctx *)0x0;
  }
  else if (extp == (lysp_ext_instance *)0x0) {
    plVar21 = ctx->ctx;
    pcVar23 = "extp";
  }
  else {
    if (ext != (lysc_ext_instance *)0x0) {
      ctx->ext = ext;
      ppvVar20 = (void **)0x0;
      local_50 = extp;
      while( true ) {
        plVar3 = extp->substmts;
        if (plVar3 == (lysp_ext_substmt *)0x0) {
          ppvVar16 = (void **)0x0;
        }
        else {
          ppvVar16 = plVar3[-1].storage_p;
        }
        if (ppvVar16 <= ppvVar20) break;
        ppvVar16 = plVar3[(long)ppvVar20].storage_p;
        if (*ppvVar16 != (void *)0x0) {
          lVar2 = plVar3[(long)ppvVar20].stmt;
          lVar12 = ly_set_contains(&storagep_compiled,ppvVar16,(uint32_t *)0x0);
          if (lVar12 == '\0') {
            plVar4 = ext->substmts;
            ppvVar17 = (void **)0xffffffffffffffff;
            plVar11 = plVar4;
            do {
              plVar27 = plVar11;
              if (plVar4 == (lysc_ext_substmt *)0x0) {
                ppvVar19 = (void **)0x0;
              }
              else {
                ppvVar19 = plVar4[-1].storage_p;
              }
              ppvVar17 = (void **)((long)ppvVar17 + 1);
              if (ppvVar19 <= ppvVar17) goto LAB_001a0d2e;
              plVar11 = plVar27 + 1;
            } while (lVar2 != plVar27->stmt);
            if ((lysp_qname *)*ppvVar16 == (lysp_qname *)0x0) {
              __assert_fail("*parsed_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts.c"
                            ,0x61,
                            "LY_ERR lys_compile_ext_instance_stmt(struct lysc_ctx *, void **, struct lysc_ext_instance *, struct lysc_ext_substmt *)"
                           );
            }
            LVar22 = LY_SUCCESS;
            if (plVar27->stmt == LY_STMT_IF_FEATURE) {
              local_68 = lys_eval_iffeatures(ctx->ctx,(lysp_qname *)*ppvVar16,&enabled);
              LVar22 = LY_SUCCESS;
              if (enabled == '\0') {
                LVar22 = LY_ENOT;
              }
              if (local_68 == LY_SUCCESS) goto LAB_001a0610;
            }
            else {
LAB_001a0610:
              when_c = (lysc_when **)plVar27->storage_p;
              local_68 = LVar22;
              if (when_c != (lysc_when **)0x0) {
                lVar2 = plVar27->stmt;
                if ((int)lVar2 < 0x130000) {
                  if ((int)lVar2 < 0x20000) {
                    if ((int)lVar2 < 0x100) {
                      if ((lVar2 - LY_STMT_NOTIFICATION < 0x40) &&
                         ((0x800000008000808bU >> ((ulong)(lVar2 - LY_STMT_NOTIFICATION) & 0x3f) & 1
                          ) != 0)) goto LAB_001a07e7;
                      if (lVar2 == LY_STMT_AUGMENT) goto LAB_001a0ce8;
                      goto LAB_001a0de2;
                    }
                    if ((int)lVar2 < 0x1000) {
                      if ((int)lVar2 < 0x400) {
                        if ((lVar2 == LY_STMT_CASE) || (lVar2 == LY_STMT_CHOICE)) goto LAB_001a07e7;
                      }
                      else {
                        if (lVar2 == LY_STMT_CONTAINER) goto LAB_001a07e7;
                        if (lVar2 == LY_STMT_GROUPING) goto LAB_001a0ce8;
                      }
                    }
                    else if ((int)lVar2 < 0x4000) {
                      if ((lVar2 == LY_STMT_LEAF) || (lVar2 == LY_STMT_LEAF_LIST))
                      goto LAB_001a07e7;
                    }
                    else {
                      if ((lVar2 == LY_STMT_LIST) || (lVar2 == LY_STMT_USES)) {
LAB_001a07e7:
                        lyplg_ext_get_storage_p(ext,0x2c0000,(void ***)&enabled);
                        if ((uint16_t *)CONCAT71(uStack_57,enabled) == (uint16_t *)0x0) {
                          uVar13 = 0;
                        }
                        else {
                          uVar13 = *(uint16_t *)CONCAT71(uStack_57,enabled);
                        }
                        for (pnode = (lysp_node *)*ppvVar16; local_68 = LVar22,
                            pnode != (lysp_node *)0x0; pnode = pnode->next) {
                          if ((pnode->nodetype & 0x3000) == 0) {
                            local_68 = lys_compile_node(ctx,pnode,(lysc_node *)0x0,uVar13,
                                                        (ly_set *)0x0);
                          }
                          else {
                            node = (lysc_node *)calloc(1,0x60);
                            if (node == (lysc_node *)0x0) {
                              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                                     "lys_compile_ext_instance_stmt");
                              local_68 = LY_EMEM;
                              break;
                            }
                            local_68 = lys_compile_node_action_inout(ctx,pnode,node);
                            extp = local_50;
                            if (local_68 != LY_SUCCESS) break;
                            local_68 = lys_compile_node_connect(ctx,(lysc_node *)0x0,node);
                            extp = local_50;
                          }
                          if (local_68 != LY_SUCCESS) break;
                          LVar22 = LY_SUCCESS;
                        }
                        goto LAB_001a0d25;
                      }
                      if (lVar2 == LY_STMT_ARGUMENT) goto LAB_001a0c52;
                    }
                  }
                  else {
                    if (0x9ffff < (int)lVar2) {
                      if ((int)lVar2 < 0xe0000) {
                        if ((int)lVar2 < 0xc0000) {
                          if (lVar2 == LY_STMT_DEVIATION) goto LAB_001a0ce8;
                          if (lVar2 == LY_STMT_ENUM) goto LAB_001a0c7e;
                        }
                        else if ((lVar2 == LY_STMT_ERROR_APP_TAG) ||
                                (lVar2 == LY_STMT_ERROR_MESSAGE)) goto LAB_001a0c52;
                        goto LAB_001a0de2;
                      }
                      if ((int)lVar2 < 0x100000) {
                        if (lVar2 == LY_STMT_EXTENSION) goto LAB_001a0ce8;
                        if (lVar2 != LY_STMT_EXTENSION_INSTANCE) goto LAB_001a0de2;
                        plVar18 = (lysp_ext_instance *)*ppvVar16;
                        if (plVar18 != (lysp_ext_instance *)0x0) {
                          plVar6 = *when_c;
                          if (plVar6 == (lysc_when *)0x0) {
                            lVar25 = 0;
                            plVar15 = (long *)calloc(1,(long)plVar18[-1].exts * 0x48 + 8);
                          }
                          else {
                            lVar25 = *(long *)&plVar6[-1].refcount;
                            plVar15 = (long *)realloc(&plVar6[-1].refcount,
                                                      ((long)&(plVar18[-1].exts)->name +
                                                      *(long *)&plVar6[-1].refcount + lVar25) * 0x48
                                                      + 8);
                          }
                          if (plVar15 == (long *)0x0) {
                            bVar9 = false;
                            local_68 = LY_EMEM;
                            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                                   "lys_compile_ext_instance_stmt");
                          }
                          else {
                            *plVar27->storage_p = plVar15 + 1;
                            if (*plVar27->storage_p != (void *)0x0) {
                              memset((void *)((long)*plVar27->storage_p + *plVar15 * 0x48),0,
                                     ((long)&(plVar18[-1].exts)->name + lVar25) * 0x48);
                            }
                            bVar9 = true;
                          }
                          if ((bVar9) && (plVar18[-1].exts != (lysp_ext_instance *)0x0)) {
                            plVar26 = (lysp_ext_instance *)0x0;
                            extp_00 = plVar18;
                            do {
                              pvVar7 = *plVar27->storage_p;
                              uVar8 = *(ulong *)((long)pvVar7 + -8);
                              *(ulong *)((long)pvVar7 + -8) = uVar8 + 1;
                              local_68 = lys_compile_ext(ctx,extp_00,
                                                         (lysc_ext_instance *)
                                                         ((long)pvVar7 +
                                                         (-(ulong)(pvVar7 == (void *)0x0) | uVar8) *
                                                         0x48),ext);
                              if (local_68 != LY_SUCCESS) {
                                if (local_68 != LY_ENOT) break;
                                plVar15 = (long *)((long)*plVar27->storage_p + -8);
                                *plVar15 = *plVar15 + -1;
                              }
                              plVar26 = (lysp_ext_instance *)((long)&plVar26->name + 1);
                              extp_00 = extp_00 + 1;
                              local_68 = LY_SUCCESS;
                            } while (plVar26 < plVar18[-1].exts);
                          }
                        }
                      }
                      else {
                        if (lVar2 == LY_STMT_FEATURE) goto LAB_001a0ce8;
                        if (lVar2 == LY_STMT_FRACTION_DIGITS) goto LAB_001a0af9;
                        if (lVar2 != LY_STMT_IDENTITY) goto LAB_001a0de2;
                        local_68 = lys_identity_precompile
                                             (ctx,(ly_ctx *)0x0,(lysp_module *)0x0,
                                              (lysp_ident *)*ppvVar16,(lysc_ident **)when_c);
                      }
                      goto LAB_001a0d25;
                    }
                    if ((int)lVar2 < 0x60000) {
                      if (0x3ffff < (int)lVar2) {
                        if (lVar2 == LY_STMT_BIT) {
LAB_001a0c7e:
                          local_68 = lys_compile_type_enums
                                               (ctx,(lysp_type_enum *)*ppvVar16,
                                                (uint)(lVar2 == LY_STMT_ENUM) * 4 + LY_TYPE_BITS,
                                                (lysc_type_bitenum_item *)0x0,
                                                (lysc_type_bitenum_item **)when_c);
                        }
                        else {
                          if (lVar2 != LY_STMT_CONFIG) goto LAB_001a0de2;
                          if ((ctx->compile_opts & 4) == 0) {
                            if ((*(ushort *)ppvVar16 & 3) == 0) {
                              if ((ext->parent_stmt &
                                  (LY_STMT_LIST|LY_STMT_LEAF_LIST|LY_STMT_LEAF|LY_STMT_CONTAINER|
                                   LY_STMT_CHOICE|LY_STMT_CASE|LY_STMT_ANYXML|LY_STMT_ANYDATA)) ==
                                  LY_STMT_NONE) {
                                uVar14 = 1;
                              }
                              else {
                                uVar14 = *(ushort *)((long)ext->parent + 2) & 3;
                              }
                            }
                            else {
                              uVar14 = *(ushort *)ppvVar16 | 0x800;
                            }
                            *(ushort *)when_c = uVar14;
                          }
                        }
                        goto LAB_001a0d25;
                      }
                      if ((lVar2 == LY_STMT_BASE) || (lVar2 == LY_STMT_BELONGS_TO))
                      goto LAB_001a0ce8;
                    }
                    else if ((int)lVar2 < 0x80000) {
                      if (lVar2 == LY_STMT_CONTACT) {
LAB_001a0c52:
                        local_68 = lydict_insert(ctx->ctx,(char *)*ppvVar16,0,(char **)when_c);
                        goto LAB_001a0d25;
                      }
                      if (lVar2 == LY_STMT_DEFAULT) goto LAB_001a0ce8;
                    }
                    else {
                      if (lVar2 == LY_STMT_DESCRIPTION) goto LAB_001a0c52;
                      if (lVar2 == LY_STMT_DEVIATE) goto LAB_001a0ce8;
                    }
                  }
LAB_001a0de2:
                  plVar21 = ctx->ctx;
                  pcVar23 = "extension instance";
                  if (lVar2 != LY_STMT_EXTENSION_INSTANCE) {
                    pcVar23 = lys_stmt_str(lVar2);
                  }
                  pcVar24 = ext->argument;
                  pcVar10 = ", ";
                  if (pcVar24 == (char *)0x0) {
                    pcVar10 = "\t";
                    pcVar24 = "";
                  }
                  ly_vlog(plVar21,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Statement \"%s\" is not supported as an extension (found in \"%s%s%s\") substatement."
                          ,pcVar23,ext->def->name,pcVar10 + 1,pcVar24);
                }
                else {
                  if ((int)lVar2 < 0x240000) {
                    if ((int)lVar2 < 0x1b0000) {
                      if ((int)lVar2 < 0x170000) {
                        if ((int)lVar2 < 0x150000) {
                          if ((lVar2 == LY_STMT_IF_FEATURE) || (lVar2 == LY_STMT_IMPORT))
                          goto LAB_001a0ce8;
                        }
                        else {
                          if (lVar2 == LY_STMT_INCLUDE) goto LAB_001a0ce8;
                          if (lVar2 == LY_STMT_KEY) goto LAB_001a0c52;
                        }
                      }
                      else if ((int)lVar2 < 0x190000) {
                        if (lVar2 == LY_STMT_LENGTH) {
                          lVar12 = '\x01';
                          goto LAB_001a0dbb;
                        }
                        if (lVar2 == LY_STMT_MANDATORY) goto LAB_001a0c70;
                      }
                      else if ((lVar2 == LY_STMT_MAX_ELEMENTS) || (lVar2 == LY_STMT_MIN_ELEMENTS)) {
                        *(undefined4 *)when_c = *(undefined4 *)ppvVar16;
                        goto LAB_001a0d25;
                      }
                    }
                    else {
                      if (0x1effff < (int)lVar2) {
                        if ((int)lVar2 < 0x210000) {
                          if (lVar2 != LY_STMT_ORDERED_BY) {
                            if (lVar2 == LY_STMT_ORGANIZATION) goto LAB_001a0c52;
                            goto LAB_001a0de2;
                          }
LAB_001a0c70:
                          *(ushort *)when_c = *(ushort *)ppvVar16;
                        }
                        else {
                          if (lVar2 == LY_STMT_PATH) goto LAB_001a0ce8;
                          if (lVar2 != LY_STMT_PATTERN) {
                            if (lVar2 == LY_STMT_POSITION) goto LAB_001a0b1d;
                            goto LAB_001a0de2;
                          }
                          local_68 = lys_compile_type_patterns
                                               (ctx,(lysp_restr *)*ppvVar16,(lysc_pattern **)0x0,
                                                (lysc_pattern ***)when_c);
                        }
                        goto LAB_001a0d25;
                      }
                      if ((int)lVar2 < 0x1d0000) {
                        if (lVar2 == LY_STMT_MODIFIER) goto LAB_001a0c52;
                        if (lVar2 == LY_STMT_MODULE) goto LAB_001a0ce8;
                      }
                      else {
                        if (lVar2 == LY_STMT_MUST) {
                          plVar5 = (lysp_restr *)*ppvVar16;
                          if (plVar5 != (lysp_restr *)0x0) {
                            plVar6 = *when_c;
                            if (plVar6 == (lysc_when *)0x0) {
                              lVar25 = 0;
                              plVar15 = (long *)calloc(1,(long)plVar5[-1].exts * 0x38 + 8);
                            }
                            else {
                              lVar25 = *(long *)&plVar6[-1].refcount;
                              plVar15 = (long *)realloc(&plVar6[-1].refcount,
                                                        ((long)&(plVar5[-1].exts)->name +
                                                        *(long *)&plVar6[-1].refcount + lVar25) *
                                                        0x38 + 8);
                            }
                            if (plVar15 == (long *)0x0) {
                              bVar9 = false;
                              local_68 = LY_EMEM;
                              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                                     "lys_compile_ext_instance_stmt");
                            }
                            else {
                              *plVar27->storage_p = plVar15 + 1;
                              if (*plVar27->storage_p != (void *)0x0) {
                                memset((void *)((long)*plVar27->storage_p + *plVar15 * 0x38),0,
                                       ((long)&(plVar5[-1].exts)->name + lVar25) * 0x38);
                              }
                              bVar9 = true;
                            }
                            if ((bVar9) && (plVar5[-1].exts != (lysp_ext_instance *)0x0)) {
                              plVar18 = (lysp_ext_instance *)0x0;
                              must_p = plVar5;
                              do {
                                pvVar7 = *plVar27->storage_p;
                                uVar8 = *(ulong *)((long)pvVar7 + -8);
                                *(ulong *)((long)pvVar7 + -8) = uVar8 + 1;
                                local_68 = lys_compile_must(ctx,must_p,
                                                            (lysc_must *)
                                                            ((-(ulong)(pvVar7 == (void *)0x0) |
                                                             uVar8) * 0x38 + (long)pvVar7));
                                if (local_68 != LY_SUCCESS) break;
                                plVar18 = (lysp_ext_instance *)((long)&plVar18->name + 1);
                                must_p = must_p + 1;
                                local_68 = LY_SUCCESS;
                              } while (plVar18 < plVar5[-1].exts);
                            }
                          }
                          goto LAB_001a0d25;
                        }
                        if (lVar2 == LY_STMT_NAMESPACE) goto LAB_001a0c52;
                      }
                    }
                    goto LAB_001a0de2;
                  }
                  if (0x2cffff < (int)lVar2) {
                    if (0x30ffff < (int)lVar2) {
                      if ((int)lVar2 < 0x330000) {
                        if (lVar2 == LY_STMT_UNITS) goto LAB_001a0c52;
                        if (lVar2 != LY_STMT_VALUE) goto LAB_001a0de2;
LAB_001a0b1d:
                        *when_c = (lysc_when *)*ppvVar16;
                      }
                      else {
                        if (lVar2 != LY_STMT_WHEN) {
                          if ((lVar2 == LY_STMT_YANG_VERSION) || (lVar2 == LY_STMT_YIN_ELEMENT))
                          goto LAB_001a0ce8;
                          goto LAB_001a0de2;
                        }
                        when_p = (lysp_when *)*ppvVar16;
                        lyplg_ext_get_storage_p(ext,0x2c0000,(void ***)&enabled);
                        if ((uint16_t *)CONCAT71(uStack_57,enabled) == (uint16_t *)0x0) {
                          uVar13 = 0;
                        }
                        else {
                          uVar13 = *(uint16_t *)CONCAT71(uStack_57,enabled);
                        }
                        local_68 = lys_compile_when(ctx,when_p,uVar13,(lysc_node *)0x0,
                                                    (lysc_node *)0x0,(lysc_node *)0x0,when_c);
                      }
                      goto LAB_001a0d25;
                    }
                    if ((int)lVar2 < 0x2f0000) {
                      if (lVar2 == LY_STMT_SUBMODULE) goto LAB_001a0ce8;
                      if (lVar2 == LY_STMT_TYPE) {
                        type_p = (lysp_type *)*ppvVar16;
                        lyplg_ext_get_storage_p(ext,0x2c0000,(void ***)&enabled);
                        if ((uint16_t *)CONCAT71(uStack_57,enabled) == (uint16_t *)0x0) {
                          uVar13 = 0;
                        }
                        else {
                          uVar13 = *(uint16_t *)CONCAT71(uStack_57,enabled);
                        }
                        lyplg_ext_get_storage_p(ext,0x310000,(void ***)&enabled);
                        if ((undefined8 *)CONCAT71(uStack_57,enabled) == (undefined8 *)0x0) {
                          local_38 = (char *)0x0;
                        }
                        else {
                          local_38 = *(char **)CONCAT71(uStack_57,enabled);
                        }
                        local_68 = lys_compile_type(ctx,(lysp_node *)0x0,uVar13,ext->def->name,
                                                    type_p,(lysc_type **)when_c,&local_38,
                                                    (lysp_qname **)0x0);
                        extp = local_50;
                        if (local_68 == LY_SUCCESS) {
                          LOCK();
                          piVar1 = (int *)((long)*plVar27->storage_p + 0x1c);
                          *piVar1 = *piVar1 + 1;
                          UNLOCK();
                        }
                        goto LAB_001a0d25;
                      }
                    }
                    else if ((lVar2 == LY_STMT_TYPEDEF) || (lVar2 == LY_STMT_UNIQUE))
                    goto LAB_001a0ce8;
                    goto LAB_001a0de2;
                  }
                  if ((int)lVar2 < 0x280000) {
                    if ((int)lVar2 < 0x260000) {
                      if (lVar2 == LY_STMT_PREFIX) goto LAB_001a0ce8;
                      if (lVar2 == LY_STMT_PRESENCE) goto LAB_001a0c52;
                    }
                    else {
                      if (lVar2 == LY_STMT_RANGE) {
                        lVar12 = '\0';
LAB_001a0dbb:
                        local_68 = lys_compile_type_range
                                             (ctx,(lysp_restr *)*ppvVar16,LY_TYPE_UINT64,lVar12,'\0'
                                              ,(lysc_range *)0x0,(lysc_range **)when_c);
                        goto LAB_001a0d25;
                      }
                      if (lVar2 == LY_STMT_REFERENCE) goto LAB_001a0c52;
                    }
                    goto LAB_001a0de2;
                  }
                  if ((int)lVar2 < 0x2a0000) {
                    if (lVar2 == LY_STMT_REFINE) goto LAB_001a0ce8;
                    if (lVar2 == LY_STMT_REQUIRE_INSTANCE) {
LAB_001a0af9:
                      *(undefined1 *)when_c = *(undefined1 *)ppvVar16;
                      goto LAB_001a0d25;
                    }
                    goto LAB_001a0de2;
                  }
                  if ((lVar2 != LY_STMT_REVISION) && (lVar2 != LY_STMT_REVISION_DATE)) {
                    if (lVar2 == LY_STMT_STATUS) goto LAB_001a0c70;
                    goto LAB_001a0de2;
                  }
LAB_001a0ce8:
                  plVar21 = ctx->ctx;
                  pcVar23 = "extension instance";
                  if (lVar2 != LY_STMT_EXTENSION_INSTANCE) {
                    pcVar23 = lys_stmt_str(lVar2);
                  }
                  ly_vlog(plVar21,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Statement \"%s\" compilation is not supported.",pcVar23);
                }
                local_68 = LY_EVALID;
              }
            }
LAB_001a0d25:
            if (local_68 != LY_SUCCESS) goto LAB_001a11f0;
LAB_001a0d2e:
            ly_set_add(&storagep_compiled,ppvVar16,'\x01',(uint32_t *)0x0);
          }
        }
        ppvVar20 = (void **)((long)ppvVar20 + 1);
      }
      local_68 = LY_SUCCESS;
LAB_001a11f0:
      ctx->ext = (lysc_ext_instance *)0x0;
      ly_set_erase(&storagep_compiled,(_func_void_void_ptr *)0x0);
      return local_68;
    }
    plVar21 = ctx->ctx;
    pcVar23 = "ext";
  }
  ly_log(plVar21,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar23,
         "lyplg_ext_compile_extension_instance");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_compile_extension_instance(struct lysc_ctx *ctx, const struct lysp_ext_instance *extp,
        struct lysc_ext_instance *ext)
{
    LY_ERR rc = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;
    enum ly_stmt stmtp;
    void **storagep;
    struct ly_set storagep_compiled = {0};

    LY_CHECK_ARG_RET(ctx ? ctx->ctx : NULL, ctx, extp, ext, LY_EINVAL);

    /* note into the compile context that we are processing extension now */
    ctx->ext = ext;

    LY_ARRAY_FOR(extp->substmts, u) {
        stmtp = extp->substmts[u].stmt;
        storagep = extp->substmts[u].storage_p;

        if (!*storagep || ly_set_contains(&storagep_compiled, storagep, NULL)) {
            /* nothing parsed or already compiled (for example, if it is a linked list of parsed nodes) */
            continue;
        }

        LY_ARRAY_FOR(ext->substmts, v) {
            if (stmtp != ext->substmts[v].stmt) {
                continue;
            }

            if ((rc = lys_compile_ext_instance_stmt(ctx, storagep, ext, &ext->substmts[v]))) {
                goto cleanup;
            }

            /* parsed substatement compiled */
            break;
        }

        /* compiled */
        ly_set_add(&storagep_compiled, storagep, 1, NULL);
    }

cleanup:
    ctx->ext = NULL;
    ly_set_erase(&storagep_compiled, NULL);
    return rc;
}